

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocators.hpp
# Opt level: O0

void __thiscall
nestl::test::allocator_with_state<int>::allocator_with_state
          (allocator_with_state<int> *this,allocator_with_state<int> *other)

{
  bool bVar1;
  allocator_with_state<int> *other_local;
  allocator_with_state<int> *this_local;
  
  impl::shared_ptr<nestl::impl::set<void_*,_std::less<void_*>,_nestl::allocator<void_*>_>_>::
  shared_ptr(&this->m_allocated_storage,&other->m_allocated_storage);
  bVar1 = impl::shared_ptr::operator_cast_to_bool((shared_ptr *)other);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!other.m_allocated_storage",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/prograholic[P]nestl/tests/allocators.hpp"
                  ,0x82,
                  "nestl::test::allocator_with_state<int>::allocator_with_state(allocator_with_state<T> &&) [T = int]"
                 );
  }
  return;
}

Assistant:

allocator_with_state(allocator_with_state&& other) NESTL_NOEXCEPT_SPEC
        : m_allocated_storage(std::move(other.m_allocated_storage))
    {
        assert(!other.m_allocated_storage);
    }